

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::ElementInstance::ParseInstanceBinary
               (IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
               char **pCur,uint *bufferSize,Element *pcElement,ElementInstance *p_pcOut,bool p_bBE)

{
  bool bVar1;
  size_type __new_size;
  reference pPVar2;
  reference pPVar3;
  Logger *this;
  ValueUnion local_60;
  __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
  local_58;
  __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
  local_50;
  const_iterator a;
  iterator i;
  bool p_bBE_local;
  ElementInstance *p_pcOut_local;
  Element *pcElement_local;
  uint *bufferSize_local;
  char **pCur_local;
  vector<char,_std::allocator<char>_> *buffer_local;
  IOStreamBuffer<char> *streamBuffer_local;
  
  if (pcElement == (Element *)0x0) {
    __assert_fail("__null != pcElement",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x32a,
                  "static bool Assimp::PLY::ElementInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstance *, bool)"
                 );
  }
  if (p_pcOut != (ElementInstance *)0x0) {
    __new_size = std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::size
                           (&pcElement->alProperties);
    std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
    resize(&p_pcOut->alProperties,__new_size);
    a._M_current = (Property *)
                   std::
                   vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>
                   ::begin(&p_pcOut->alProperties);
    local_50._M_current =
         (Property *)
         std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>::begin
                   (&pcElement->alProperties);
    while( true ) {
      local_58._M_current =
           (PropertyInstance *)
           std::
           vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>::
           end(&p_pcOut->alProperties);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                          *)&a,&local_58);
      if (!bVar1) break;
      pPVar2 = __gnu_cxx::
               __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
               ::operator*(&local_50);
      pPVar3 = __gnu_cxx::
               __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
               ::operator*((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                            *)&a);
      bVar1 = PropertyInstance::ParseInstanceBinary
                        (streamBuffer,buffer,pCur,bufferSize,pPVar2,pPVar3,p_bBE);
      if (!bVar1) {
        this = DefaultLogger::get();
        Logger::warn(this,"Unable to parse binary property instance. Skipping this element instance"
                    );
        pPVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                 ::operator*((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                              *)&a);
        pPVar2 = __gnu_cxx::
                 __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
                 ::operator*(&local_50);
        local_60 = PropertyInstance::DefaultValue(pPVar2->eType);
        std::
        vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ::push_back(&pPVar3->avList,&local_60);
      }
      __gnu_cxx::
      __normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
      ::operator++((__normal_iterator<Assimp::PLY::PropertyInstance_*,_std::vector<Assimp::PLY::PropertyInstance,_std::allocator<Assimp::PLY::PropertyInstance>_>_>
                    *)&a);
      __gnu_cxx::
      __normal_iterator<const_Assimp::PLY::Property_*,_std::vector<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>_>
      ::operator++(&local_50);
    }
    return true;
  }
  __assert_fail("__null != p_pcOut",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                ,0x32b,
                "static bool Assimp::PLY::ElementInstance::ParseInstanceBinary(IOStreamBuffer<char> &, std::vector<char> &, const char *&, unsigned int &, const PLY::Element *, PLY::ElementInstance *, bool)"
               );
}

Assistant:

bool PLY::ElementInstance::ParseInstanceBinary(
  IOStreamBuffer<char> &streamBuffer,
  std::vector<char> &buffer,
  const char* &pCur,
  unsigned int &bufferSize,
  const PLY::Element* pcElement,
  PLY::ElementInstance* p_pcOut,
  bool p_bBE /* = false */)
{
  ai_assert(NULL != pcElement);
  ai_assert(NULL != p_pcOut);

  // allocate enough storage
  p_pcOut->alProperties.resize(pcElement->alProperties.size());

  std::vector<PLY::PropertyInstance>::iterator i = p_pcOut->alProperties.begin();
  std::vector<PLY::Property>::const_iterator   a = pcElement->alProperties.begin();
  for (; i != p_pcOut->alProperties.end(); ++i, ++a)
  {
    if (!(PLY::PropertyInstance::ParseInstanceBinary(streamBuffer, buffer, pCur, bufferSize, &(*a), &(*i), p_bBE)))
    {
        ASSIMP_LOG_WARN("Unable to parse binary property instance. "
        "Skipping this element instance");

      (*i).avList.push_back(PLY::PropertyInstance::DefaultValue((*a).eType));
    }
  }
  return true;
}